

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstrumentMemory.cpp
# Opt level: O0

void __thiscall wasm::InstrumentMemory::visitArraySet(InstrumentMemory *this,ArraySet *curr)

{
  Index IVar1;
  initializer_list<wasm::Expression_*> __l;
  Name target_00;
  initializer_list<wasm::Expression_*> __l_00;
  Name target_01;
  bool bVar2;
  Module *wasm;
  Call *pCVar3;
  allocator<wasm::Expression_*> local_101;
  Const *local_100;
  pointer local_f8;
  Const **local_f0;
  size_type local_e8;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_e0;
  size_t local_c8;
  char *pcStack_c0;
  BasicType local_b0 [4];
  undefined1 auStack_a0 [8];
  Name target;
  allocator<wasm::Expression_*> local_71;
  Const *local_70;
  pointer local_68;
  Const **local_60;
  size_type local_58;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_50;
  size_t local_38;
  char *pcStack_30;
  Builder local_20;
  Builder builder;
  ArraySet *curr_local;
  InstrumentMemory *this_local;
  
  builder.wasm = (Module *)curr;
  wasm = Walker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>::getModule
                   (&(this->
                     super_WalkerPass<wasm::PostWalker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>_>
                     ).
                     super_PostWalker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>
                     .
                     super_Walker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>
                   );
  Builder::Builder(&local_20,wasm);
  local_38 = array_set_index;
  pcStack_30 = DAT_031939d0;
  IVar1 = this->id;
  this->id = IVar1 + 1;
  local_70 = Builder::makeConst<int>(&local_20,IVar1);
  local_68 = ((builder.wasm)->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_60 = &local_70;
  local_58 = 2;
  std::allocator<wasm::Expression_*>::allocator(&local_71);
  __l_00._M_len = local_58;
  __l_00._M_array = (iterator)local_60;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            (&local_50,__l_00,&local_71);
  wasm::Type::Type((Type *)&target.super_IString.str._M_str,i32);
  target_01.super_IString.str._M_str = pcStack_30;
  target_01.super_IString.str._M_len = local_38;
  pCVar3 = Builder::makeCall(&local_20,target_01,&local_50,(Type)target.super_IString.str._M_str,
                             false);
  ((builder.wasm)->functions).
  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)pCVar3;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector(&local_50);
  std::allocator<wasm::Expression_*>::~allocator(&local_71);
  wasm::Name::Name((Name *)auStack_a0);
  local_b0[3] = 2;
  bVar2 = wasm::Type::operator==
                    ((Type *)(((builder.wasm)->functions).
                              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish + 1),local_b0 + 3);
  if (bVar2) {
    wasm::Name::operator=((Name *)auStack_a0,(Name *)&array_set_val_i32);
  }
  else {
    local_b0[2] = 3;
    bVar2 = wasm::Type::operator==
                      ((Type *)(((builder.wasm)->functions).
                                super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish + 1),local_b0 + 2);
    if (bVar2) {
      wasm::Name::operator=((Name *)auStack_a0,(Name *)&array_set_val_i64);
    }
    else {
      local_b0[1] = 4;
      bVar2 = wasm::Type::operator==
                        ((Type *)(((builder.wasm)->functions).
                                  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish + 1),local_b0 + 1);
      if (bVar2) {
        wasm::Name::operator=((Name *)auStack_a0,(Name *)&array_set_val_f32);
      }
      else {
        local_b0[0] = f64;
        bVar2 = wasm::Type::operator==
                          ((Type *)(((builder.wasm)->functions).
                                    super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish + 1),local_b0);
        if (!bVar2) {
          return;
        }
        wasm::Name::operator=((Name *)auStack_a0,(Name *)&array_set_val_f64);
      }
    }
  }
  local_c8 = (size_t)auStack_a0;
  pcStack_c0 = (char *)target.super_IString.str._M_len;
  IVar1 = this->id;
  this->id = IVar1 + 1;
  local_100 = Builder::makeConst<int>(&local_20,IVar1);
  local_f8 = ((builder.wasm)->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_f0 = &local_100;
  local_e8 = 2;
  std::allocator<wasm::Expression_*>::allocator(&local_101);
  __l._M_len = local_e8;
  __l._M_array = (iterator)local_f0;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            (&local_e0,__l,&local_101);
  target_00.super_IString.str._M_str = pcStack_c0;
  target_00.super_IString.str._M_len = local_c8;
  pCVar3 = Builder::makeCall(&local_20,target_00,&local_e0,
                             (Type)((builder.wasm)->functions).
                                   super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish[1]._M_t.
                                   super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                   .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,
                             false);
  ((builder.wasm)->functions).
  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)pCVar3;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector(&local_e0);
  std::allocator<wasm::Expression_*>::~allocator(&local_101);
  return;
}

Assistant:

void visitArraySet(ArraySet* curr) {
    Builder builder(*getModule());
    curr->index =
      builder.makeCall(array_set_index,
                       {builder.makeConst(int32_t(id++)), curr->index},
                       Type::i32);
    Name target;
    if (curr->value->type == Type::i32) {
      target = array_set_val_i32;
    } else if (curr->value->type == Type::i64) {
      target = array_set_val_i64;
    } else if (curr->value->type == Type::f32) {
      target = array_set_val_f32;
    } else if (curr->value->type == Type::f64) {
      target = array_set_val_f64;
    } else {
      return; // TODO: other types, unreachable, etc.
    }
    curr->value =
      builder.makeCall(target,
                       {builder.makeConst(int32_t(id++)), curr->value},
                       curr->value->type);
  }